

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

uintptr_t NodeParamMeta(nodeclass *Class,uint_fast32_t Meta,dataid Id,node *Node)

{
  uint uVar1;
  long lVar2;
  uintptr_t *puVar3;
  nodeclass *pnVar4;
  uintptr_t Data;
  long local_38;
  
  do {
    if (Class == (nodeclass *)0x0) {
      return 0;
    }
    if (Class->Meta != (nodemeta *)0x0) {
      puVar3 = &Class->Meta->Data;
      while( true ) {
        uVar1 = *(uint *)(puVar3 + -1) & 0xff;
        if ((ulong)uVar1 == 0) break;
        if (*(uint *)(puVar3 + -1) >> 8 == Id) {
          if (uVar1 == Meta) {
            return *puVar3;
          }
          if ((uVar1 == 0x32) && (lVar2 = (*(code *)*puVar3)(Node,Id,Meta,&Data), lVar2 != 0)) {
            return Data;
          }
        }
        puVar3 = puVar3 + 2;
      }
    }
    if (Meta == 0x2c) {
      local_38 = *(long *)(Class + 1);
      pnVar4 = Class;
      while (lVar2 = local_38, pnVar4 = pnVar4->ParentClass, pnVar4 != (nodeclass *)0x0) {
        if (pnVar4->Meta != (nodemeta *)0x0) {
          puVar3 = &pnVar4->Meta->Data;
          while( true ) {
            uVar1 = *(uint *)(puVar3 + -1) & 0xff;
            if (uVar1 == 0) break;
            if ((uVar1 == 0x32 && *(uint *)(puVar3 + -1) >> 8 == Id) &&
               (lVar2 = (*(code *)*puVar3)(Node,Id,0x2c,&Data), lVar2 != 0)) {
              return Data;
            }
            puVar3 = puVar3 + 2;
          }
        }
      }
      if (*(long *)(local_38 + 0xa0) != 0) {
        while ((Data = (**(code **)(lVar2 + 0xa0))
                                 (lVar2,*(undefined4 *)&Class[1].Meta,Id & 0xffffffff),
               (char *)Data == (char *)0x0 || (*(char *)Data == '\0'))) {
          Class = Class->ParentClass;
          if (Class == (nodeclass *)0x0) {
            return (uintptr_t)"";
          }
        }
        return (uintptr_t)(char *)Data;
      }
    }
    Class = Class->ParentClass;
  } while( true );
}

Assistant:

static uintptr_t NOINLINE NodeParamMeta(const nodeclass* Class, uint_fast32_t Meta, dataid Id, const node* Node)
{
    uintptr_t Data;
    const nodemeta* m;

    for (;Class;Class=Class->ParentClass)
    {
        if (Class->Meta) // should be registered, just fail safe
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                if (m->Id == Id)
                {
                    if (m->Meta == Meta)
                        return m->Data;
                    if (m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                        return Data;
                }

        if (Meta == META_PARAM_STRING)
        {
            const nodeclass* MainClass = Class;
            nodecontext* Context = NodeClass_Context(Class);

            // only check for META_PARAM_META...
            while ((Class=Class->ParentClass)!=NULL)
            {
                if (Class->Meta) // should be registered, just fail safe
                    for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                        if (m->Id == Id && m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                            return Data;
            }

            Class = MainClass;
            if (Context->ExternalStr)
            {
                do {
                    Data = (uintptr_t)Context->ExternalStr(Context,NodeClass_ClassId(Class),(int)Id);
                    if (Data!=0 && *((const tchar_t*)Data))
                        return Data;
                } while ((Class=Class->ParentClass)!=NULL);
                return (uintptr_t)T("");
            }
        }
    }
    return 0;
}